

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_dynamic.cpp
# Opt level: O1

void multikey_dynamic<vector_brodnik<unsigned_char*>,unsigned_int>
               (uchar **strings,size_t N,size_t depth)

{
  uchar *puVar1;
  uchar **ppuVar2;
  byte bVar3;
  uint j;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  long lVar7;
  vector_brodnik<unsigned_char_*> *this;
  long lVar8;
  size_t N_00;
  long lVar9;
  size_t sVar10;
  long lVar11;
  uint j_1;
  uchar **ppuVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  array<vector_brodnik<unsigned_char_*>,_3UL> buckets;
  array<unsigned_int,_32UL> cache;
  long local_1b8;
  ulong local_1b0;
  vector_brodnik<unsigned_char_*> local_160;
  vector_brodnik<unsigned_char_*> local_128;
  vector_brodnik<unsigned_char_*> local_f0;
  size_t local_b8;
  uint auStack_b0 [32];
  
  if (N < 10000) {
    mkqsort(strings,(int)N,(int)depth);
    return;
  }
  lVar13 = 0;
  do {
    this = (vector_brodnik<unsigned_char_*> *)
           ((long)&local_160._index_block.
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar13);
    (this->_index_block).super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    *(undefined8 *)
     ((long)&local_160._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_finish + lVar13) = 0;
    *(undefined8 *)
     ((long)&local_160._index_block.
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + lVar13) = 0;
    vector_brodnik<unsigned_char_*>::clear(this);
    lVar13 = lVar13 + 0x38;
  } while (lVar13 != 0xa8);
  uVar4 = pseudo_median<unsigned_int>(strings,N,depth);
  if ((N & 0xffffffffffffffe0) == 0) {
    sVar10 = 0;
  }
  else {
    sVar10 = 0;
    ppuVar12 = strings;
    do {
      lVar13 = 0;
      do {
        puVar1 = ppuVar12[lVar13];
        if (puVar1 == (uchar *)0x0) goto LAB_0021dc5d;
        bVar3 = puVar1[depth];
        if (bVar3 == 0) {
          uVar5 = 0;
        }
        else {
          uVar5 = (uint)bVar3 << 0x18;
          if (puVar1[depth + 1] != 0) {
            uVar5 = (uint)bVar3 << 0x18 | (uint)puVar1[depth + 1] << 0x10;
            if (puVar1[depth + 2] != '\0') {
              uVar5 = uVar5 | CONCAT11(puVar1[depth + 2],puVar1[depth + 3]);
            }
          }
        }
        auStack_b0[lVar13] = uVar5;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x20);
      lVar13 = 0;
      do {
        uVar5 = auStack_b0[lVar13];
        lVar7 = (ulong)(uVar5 == uVar4) + (ulong)(uVar4 <= uVar5 && uVar5 != uVar4) * 2;
        if ((&local_160)[lVar7]._left_in_block == 0) {
          vector_brodnik<unsigned_char_*>::grow(&local_160 + lVar7);
        }
        puVar1 = ppuVar12[lVar13];
        ppuVar2 = (&local_160)[lVar7]._insertpos;
        (&local_160)[lVar7]._insertpos = ppuVar2 + 1;
        *ppuVar2 = puVar1;
        (&local_160)[lVar7]._left_in_block = (&local_160)[lVar7]._left_in_block - 1;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x20);
      sVar10 = sVar10 + 0x20;
      ppuVar12 = ppuVar12 + 0x20;
    } while (sVar10 < (N & 0xffffffffffffffe0));
  }
  if (sVar10 < N) {
    do {
      puVar1 = strings[sVar10];
      if (puVar1 == (uchar *)0x0) {
LAB_0021dc5d:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x38,"uint32_t get_char(unsigned char *, size_t)");
      }
      if (puVar1[depth] == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = (uint)puVar1[depth] << 0x18;
        if (puVar1[depth + 1] != 0) {
          uVar5 = uVar5 | (uint)puVar1[depth + 1] << 0x10;
          if (puVar1[depth + 2] != '\0') {
            uVar5 = uVar5 | CONCAT11(puVar1[depth + 2],puVar1[depth + 3]);
          }
        }
      }
      lVar13 = (ulong)(uVar5 == uVar4) + (ulong)(uVar4 <= uVar5 && uVar5 != uVar4) * 2;
      if ((&local_160)[lVar13]._left_in_block == 0) {
        vector_brodnik<unsigned_char_*>::grow(&local_160 + lVar13);
      }
      puVar1 = strings[sVar10];
      ppuVar12 = (&local_160)[lVar13]._insertpos;
      (&local_160)[lVar13]._insertpos = ppuVar12 + 1;
      *ppuVar12 = puVar1;
      (&local_160)[lVar13]._left_in_block = (&local_160)[lVar13]._left_in_block - 1;
      sVar10 = sVar10 + 1;
    } while (N != sVar10);
  }
  lVar7 = (long)(2 << (local_160._superblock & 0x1f)) + -0x40;
  lVar13 = local_160._left_in_superblock * local_160._block_size + local_160._left_in_block;
  N_00 = lVar7 - lVar13;
  lVar14 = local_128._left_in_superblock * local_128._block_size + local_128._left_in_block;
  lVar11 = (long)(2 << (local_128._superblock & 0x1f)) + -0x40;
  sVar10 = lVar11 - lVar14;
  lVar8 = (long)(2 << (local_f0._superblock & 0x1f)) + -0x40;
  lVar9 = local_f0._left_in_superblock * local_f0._block_size + local_f0._left_in_block;
  local_b8 = lVar8 - lVar9;
  if (sVar10 + N_00 + local_b8 != N) {
    __assert_fail("bucketsize0 + bucketsize1 + bucketsize2 == N",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_dynamic.cpp"
                  ,0x5d,
                  "void multikey_dynamic(unsigned char **, size_t, size_t) [BucketT = vector_brodnik<unsigned char *>, CharT = unsigned int]"
                 );
  }
  if (lVar7 != lVar13) {
    ppuVar12 = strings;
    if (local_160._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_160._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_1b8 = 8;
      local_1b0 = 0;
      lVar13 = 8;
      bVar3 = 0;
      do {
        if (lVar13 != 0) {
          lVar7 = lVar13;
          uVar15 = local_1b0;
          do {
            if (uVar15 == ((long)local_160._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_160._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U)
            goto LAB_0021d943;
            if (local_1b8 != 0) {
              memmove(ppuVar12,local_160._index_block.
                               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar15],local_1b8 * 8);
            }
            uVar15 = uVar15 + 1;
            ppuVar12 = ppuVar12 + local_1b8;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
        local_1b0 = local_1b0 + lVar13;
        lVar13 = lVar13 << bVar3;
        bVar3 = bVar3 ^ 1;
        local_1b8 = local_1b8 << bVar3;
      } while (local_1b0 <
               (ulong)((long)local_160._index_block.
                             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_160._index_block.
                             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
LAB_0021d943:
    sVar6 = (long)local_160._insertpos -
            (long)local_160._index_block.
                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
    if (sVar6 != 0) {
      memmove(ppuVar12,local_160._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1],sVar6);
    }
  }
  if (lVar11 != lVar14) {
    ppuVar12 = strings + N_00;
    if (local_128._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_128._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_1b8 = 8;
      uVar15 = 0;
      lVar13 = 8;
      bVar3 = 0;
      do {
        if (lVar13 != 0) {
          lVar7 = lVar13;
          uVar16 = uVar15;
          do {
            if (uVar16 == ((long)local_128._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_128._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U)
            goto LAB_0021da4c;
            if (local_1b8 != 0) {
              memmove(ppuVar12,local_128._index_block.
                               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar16],local_1b8 * 8);
            }
            uVar16 = uVar16 + 1;
            ppuVar12 = ppuVar12 + local_1b8;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
        uVar15 = uVar15 + lVar13;
        lVar13 = lVar13 << bVar3;
        bVar3 = bVar3 ^ 1;
        local_1b8 = local_1b8 << bVar3;
      } while (uVar15 < (ulong)((long)local_128._index_block.
                                      super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_128._index_block.
                                      super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
LAB_0021da4c:
    sVar6 = (long)local_128._insertpos -
            (long)local_128._index_block.
                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
    if (sVar6 != 0) {
      memmove(ppuVar12,local_128._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1],sVar6);
    }
  }
  if (lVar8 != lVar9) {
    ppuVar12 = strings + N_00 + sVar10;
    if (local_f0._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_f0._index_block.
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_1b8 = 8;
      local_1b0 = 0;
      lVar13 = 8;
      bVar3 = 0;
      do {
        if (lVar13 != 0) {
          lVar7 = lVar13;
          uVar15 = local_1b0;
          do {
            if (uVar15 == ((long)local_f0._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_f0._index_block.
                                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U)
            goto LAB_0021dbaf;
            if (local_1b8 != 0) {
              memmove(ppuVar12,local_f0._index_block.
                               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar15],local_1b8 * 8);
            }
            uVar15 = uVar15 + 1;
            ppuVar12 = ppuVar12 + local_1b8;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
        local_1b0 = local_1b0 + lVar13;
        lVar13 = lVar13 << bVar3;
        bVar3 = bVar3 ^ 1;
        local_1b8 = local_1b8 << bVar3;
      } while (local_1b0 <
               (ulong)((long)local_f0._index_block.
                             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_f0._index_block.
                             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
LAB_0021dbaf:
    sVar6 = (long)local_f0._insertpos -
            (long)local_f0._index_block.
                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
    if (sVar6 != 0) {
      memmove(ppuVar12,local_f0._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1],sVar6);
    }
  }
  vector_brodnik<unsigned_char_*>::clear(&local_160);
  vector_brodnik<unsigned_char_*>::clear(&local_128);
  vector_brodnik<unsigned_char_*>::clear(&local_f0);
  multikey_dynamic<vector_brodnik<unsigned_char*>,unsigned_int>(strings,N_00,depth);
  if ((char)uVar4 != '\0') {
    multikey_dynamic<vector_brodnik<unsigned_char*>,unsigned_int>(strings + N_00,sVar10,depth + 4);
  }
  multikey_dynamic<vector_brodnik<unsigned_char*>,unsigned_int>
            (strings + N_00 + sVar10,local_b8,depth);
  lVar13 = 0x70;
  do {
    vector_brodnik<unsigned_char_*>::~vector_brodnik
              ((vector_brodnik<unsigned_char_*> *)
               ((long)&local_160._index_block.
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar13));
    lVar13 = lVar13 + -0x38;
  } while (lVar13 != -0x38);
  return;
}

Assistant:

static void
multikey_dynamic(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 10000) {
		mkqsort(strings, N, depth);
		return;
	}
	std::array<BucketT, 3> buckets;
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < N-N%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const unsigned b = get_bucket(cache[j], partval);
			buckets[b].push_back(strings[i+j]);
		}
	}
	for (; i < N; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		buckets[b].push_back(strings[i]);
	}
	const size_t bucketsize0 = buckets[0].size();
	const size_t bucketsize1 = buckets[1].size();
	const size_t bucketsize2 = buckets[2].size();
	assert(bucketsize0 + bucketsize1 + bucketsize2 == N);
	if (bucketsize0) copy(buckets[0], strings);
	if (bucketsize1) copy(buckets[1], strings+bucketsize0);
	if (bucketsize2) copy(buckets[2], strings+bucketsize0+bucketsize1);
	clear_bucket(buckets[0]);
	clear_bucket(buckets[1]);
	clear_bucket(buckets[2]);
	multikey_dynamic<BucketT, CharT>(strings, bucketsize0, depth);
	if (not is_end(partval))
		multikey_dynamic<BucketT, CharT>(strings+bucketsize0,
				bucketsize1, depth+sizeof(CharT));
	multikey_dynamic<BucketT, CharT>(strings+bucketsize0+bucketsize1,
			bucketsize2, depth);
}